

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlocksBuilder.h
# Opt level: O1

bool __thiscall
dg::BBlocksBuilder<dg::dda::RWBBlock>::enqueue(BBlocksBuilder<dg::dda::RWBBlock> *this,NodeT *n)

{
  iterator *piVar1;
  _Elt_pointer ppRVar2;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar3;
  NodeT *local_20;
  IDType local_14;
  
  local_14 = (n->super_SubgraphNode<dg::dda::RWNode>).id;
  local_20 = n;
  pVar3 = std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_insert_unique<unsigned_int>(&(this->_processed)._M_t,&local_14);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    ppRVar2 = (this->_queue).Container.c.
              super__Deque_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppRVar2 ==
        *(_Elt_pointer *)
         ((long)&(this->_queue).Container.c.
                 super__Deque_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Deque_impl_data._M_finish + 0x10) + -1) {
      std::deque<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
      _M_push_back_aux<dg::dda::RWNode*const&>
                ((deque<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)&this->_queue,&local_20
                );
    }
    else {
      *ppRVar2 = local_20;
      piVar1 = &(this->_queue).Container.c.
                super__Deque_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  return (bool)(pVar3.second & 1);
}

Assistant:

bool enqueue(NodeT *n) {
        // the id 0 is reserved for invalid nodes
        assert(n->getID() != 0 && "Queued invalid node");

        if (!static_cast<bool>(_processed.insert(n->getID()).second))
            return false; // we already queued this node

        _queue.push(n);
        assert(enqueue(n) == false);
        return true;
    }